

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O2

void __thiscall ktxApp::writeId(ktxApp *this,ostream *dst,bool chktest)

{
  ostream *poVar1;
  long lVar2;
  undefined3 in_register_00000011;
  
  poVar1 = std::operator<<(dst,(string *)&this->name);
  std::operator<<(poVar1," ");
  if (CONCAT31(in_register_00000011,chktest) == 0) {
    lVar2 = 0x28;
  }
  else {
    lVar2 = (ulong)(this->options->test != 0) * 8 + 0x28;
  }
  std::operator<<(dst,*(string **)((long)&this->_vptr_ktxApp + lVar2));
  return;
}

Assistant:

void writeId(std::ostream& dst, bool chktest) {
        dst << name << " ";
        dst << (!chktest || !options.test ? version : defaultVersion);
    }